

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O0

void __thiscall BVFixed::Dump(BVFixed *this)

{
  BVIndex BVar1;
  uint local_18;
  bool local_11;
  BVIndex i;
  bool hasBits;
  BVFixed *this_local;
  
  local_11 = false;
  Output::Print(L"[  ");
  local_18 = 0;
  while( true ) {
    BVar1 = WordCount(this);
    if (BVar1 <= local_18) break;
    local_11 = BVUnitT<unsigned_long>::Dump
                         ((BVUnitT<unsigned_long> *)(this + (ulong)local_18 + 1),local_18 << 6,
                          local_11);
    local_18 = local_18 + 1;
  }
  Output::Print(L"]\n");
  return;
}

Assistant:

void
BVFixed::Dump() const
{
    bool hasBits = false;
    Output::Print(_u("[  "));
    for(BVIndex i=0; i < this->WordCount(); i++)
    {
        hasBits = this->data[i].Dump(i * BVUnit::BitsPerWord, hasBits);
    }
    Output::Print(_u("]\n"));
}